

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_startCase(qpTestLog *log,char *testCasePath,qpTestCaseType testCaseType)

{
  char *pcVar1;
  deBool dVar2;
  qpXmlAttribute resultAttribs [8];
  
  pcVar1 = s_qpTestTypeMap[(int)testCaseType].string;
  deMutex_lock(log->lock);
  qpXmlWriter_flush(log->writer);
  fprintf((FILE *)log->outputFile,"\n#beginTestCaseResult %s\n",testCasePath);
  if ((log->flags & 4) == 0) {
    qpTestLog_flushFile(log);
  }
  log->isCaseOpen = 1;
  resultAttribs[0].name = "Version";
  resultAttribs[0].type = QP_XML_ATTRIBUTE_STRING;
  resultAttribs[0].stringValue = "0.3.4";
  resultAttribs[0].intValue = -0x2a6;
  resultAttribs[0].boolValue = -1;
  resultAttribs[1].name = "CasePath";
  resultAttribs[1].type = QP_XML_ATTRIBUTE_STRING;
  resultAttribs[1].intValue = -0x2a6;
  resultAttribs[1].boolValue = -1;
  resultAttribs[2].name = "CaseType";
  resultAttribs[2].type = QP_XML_ATTRIBUTE_STRING;
  resultAttribs[2].intValue = -0x2a6;
  resultAttribs[2].boolValue = -1;
  resultAttribs[1].stringValue = testCasePath;
  resultAttribs[2].stringValue = pcVar1;
  dVar2 = qpXmlWriter_startDocument(log->writer);
  if (dVar2 != 0) {
    dVar2 = qpXmlWriter_startElement(log->writer,"TestCaseResult",3,resultAttribs);
    if (dVar2 != 0) {
      dVar2 = 1;
      goto LAB_007e3e3f;
    }
  }
  dVar2 = 0;
  qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
LAB_007e3e3f:
  deMutex_unlock(log->lock);
  return dVar2;
}

Assistant:

deBool qpTestLog_startCase (qpTestLog* log, const char* testCasePath, qpTestCaseType testCaseType)
{
	const char*		typeStr				= QP_LOOKUP_STRING(s_qpTestTypeMap, testCaseType);
	int				numResultAttribs	= 0;
	qpXmlAttribute	resultAttribs[8];

	DE_ASSERT(log && testCasePath && (testCasePath[0] != 0));
	deMutex_lock(log->lock);

	DE_ASSERT(!log->isCaseOpen);
	DE_ASSERT(ContainerStack_isEmpty(&log->containerStack));

	/* Flush XML and write out #beginTestCaseResult. */
	qpXmlWriter_flush(log->writer);
	fprintf(log->outputFile, "\n#beginTestCaseResult %s\n", testCasePath);
	if (!(log->flags & QP_TEST_LOG_NO_FLUSH))
		qpTestLog_flushFile(log);

	log->isCaseOpen = DE_TRUE;

	/* Fill in attributes. */
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("Version", LOG_FORMAT_VERSION);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CasePath", testCasePath);
	resultAttribs[numResultAttribs++] = qpSetStringAttrib("CaseType", typeStr);

	if (!qpXmlWriter_startDocument(log->writer) ||
		!qpXmlWriter_startElement(log->writer, "TestCaseResult", numResultAttribs, resultAttribs))
	{
		qpPrintf("qpTestLog_startCase(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}